

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O0

double __thiscall ON_OutlineFigure::AreaEstimate(ON_OutlineFigure *this)

{
  bool bVar1;
  float fVar2;
  ON_OutlineFigurePoint *pOVar3;
  ON_OutlineFigurePoint *pOVar4;
  double dVar5;
  ON_2dPoint local_250;
  ON_2dPoint local_240;
  ON_2dPoint local_230;
  ON_2dPoint local_220;
  ON_2dPoint local_210;
  ON_2dPoint local_200;
  ON_2dPoint local_1f0;
  int local_1e0;
  int local_1dc;
  int j_1;
  int cvdex_1;
  double t_1;
  undefined1 auStack_1c8 [4];
  int tdex_1;
  ON_2dPoint local_1b8;
  ON_2dPoint local_1a8;
  ON_2dPoint local_198;
  ON_2dPoint local_188;
  int local_178;
  int local_174;
  int j;
  int cvdex;
  double t;
  undefined1 auStack_160 [4];
  int tdex;
  ON_OutlineFigurePoint p;
  ON__UINT32 i;
  double twice_area;
  double cubic [3] [4];
  double quad [3] [3];
  undefined1 local_98 [8];
  ON_2dPoint p1;
  ON_2dPoint p0;
  ON_2dPoint cv [4];
  ON_OutlineFigurePoint figure_end;
  ON_OutlineFigurePoint figure_start;
  ON_OutlineFigurePoint *a;
  ON__UINT32 figure_end_dex;
  ON_OutlineFigure *this_local;
  
  if (this->m_area_status == '\0') {
    this->m_area_estimate = ON_DBL_QNAN;
    this->m_area_status = '\a';
    fVar2 = (float)Internal_FigureEndDex(this,false);
    if (fVar2 != 0.0) {
      pOVar3 = ON_SimpleArray<ON_OutlineFigurePoint>::Array(&this->m_points);
      figure_end.m_point = *(ON_2fPoint *)pOVar3;
      cv[3].y = *(double *)(pOVar3 + (uint)fVar2);
      figure_end._0_4_ = pOVar3[(uint)fVar2].m_point.y;
      if (((figure_end.m_point.x._0_1_ == '\x02') || (cv[3].y._0_1_ == '\v')) || ((uint)fVar2 < 3))
      {
        this->m_area_estimate = 0.0;
        this->m_area_status = '\x01';
        if (((this->m_figure_type == Perimeter) || (this->m_figure_type == Unset)) ||
           (this->m_figure_type == Unknown)) {
          this->m_figure_type = NotPerimeter;
        }
      }
      else {
        cubic[2][3] = -1.23432101234321e+308;
        stack0xfffffffffffffeb0 = 0.0;
        ON_2dPoint::operator=((ON_2dPoint *)local_98,(ON_2fPoint *)&figure_end.m_point.y);
        for (p.m_point.x = 1.4013e-45; (uint)p.m_point.x < (uint)fVar2;
            p.m_point.x = (float)((int)p.m_point.x + 1)) {
          pOVar4 = pOVar3 + (uint)p.m_point.x;
          auStack_160[0] = pOVar4->m_point_type;
          auStack_160[1] = pOVar4->m_point_proximity;
          auStack_160._2_2_ = pOVar4->m_figure_index;
          unique0x00012004 = (pOVar4->m_point).x;
          p._0_4_ = (pOVar4->m_point).y;
          p1.y = (double)local_98;
          p0.x = p1.x;
          ON_2dPoint::operator=((ON_2dPoint *)local_98,(ON_2fPoint *)&tdex);
          if (auStack_160[0] == LineTo) {
            dVar5 = Internal_DeltaArea((ON_2dPoint *)&p1.y,(ON_2dPoint *)local_98);
            register0x00001200 = dVar5 + stack0xfffffffffffffeb0;
          }
          else if (auStack_160[0] == QuadraticBezierPoint) {
            bVar1 = ON_OutlineFigurePoint::IsOffFigure((ON_OutlineFigurePoint *)auStack_160);
            if (((!bVar1) || ((uint)fVar2 <= (int)p.m_point.x + 1U)) ||
               ((auStack_160[0] != pOVar3[(int)p.m_point.x + 1].m_point_type ||
                (bVar1 = ON_OutlineFigurePoint::IsOnFigure(pOVar3 + ((int)p.m_point.x + 1)), !bVar1)
                ))) break;
            if ((cubic[2][3] == -1.23432101234321e+308) && (!NAN(cubic[2][3]))) {
              for (t._4_4_ = 1; t._4_4_ < 4; t._4_4_ = t._4_4_ + 1) {
                _j = (double)t._4_4_ * 0.25;
                for (local_174 = 0; local_174 < 3; local_174 = local_174 + 1) {
                  dVar5 = ON_EvaluateBernsteinBasis(2,local_174,_j);
                  quad[(long)(t._4_4_ + -1) + -1][(long)local_174 + 2] = dVar5;
                }
              }
            }
            p0.y = p1.y;
            cv[0].x = p0.x;
            cv[0].y = (double)local_98;
            cv[1].x = p1.x;
            p.m_point.x = (float)((int)p.m_point.x + 1);
            ON_2dPoint::operator=((ON_2dPoint *)&cv[1].y,&pOVar3[(uint)p.m_point.x].m_point);
            local_98 = (undefined1  [8])p1.y;
            p1.x = p0.x;
            for (local_178 = 0; local_178 < 3; local_178 = local_178 + 1) {
              p1.y = (double)local_98;
              p0.x = p1.x;
              local_1a8 = ::operator*(quad[(long)local_178 + -1][2],(ON_2dPoint *)&p0.y);
              local_1b8 = ::operator*(quad[local_178][0],(ON_2dPoint *)&cv[0].y);
              local_198 = ON_2dPoint::operator+(&local_1a8,&local_1b8);
              _auStack_1c8 = ::operator*(quad[local_178][1],(ON_2dPoint *)&cv[1].y);
              local_188 = ON_2dPoint::operator+(&local_198,(ON_2dPoint *)auStack_1c8);
              local_98 = (undefined1  [8])local_188.x;
              p1.x = local_188.y;
              dVar5 = Internal_DeltaArea((ON_2dPoint *)&p1.y,(ON_2dPoint *)local_98);
              register0x00001200 = dVar5 + stack0xfffffffffffffeb0;
            }
            p1.y = (double)local_98;
            p0.x = p1.x;
            local_98 = (undefined1  [8])cv[1].y;
            p1.x = cv[2].x;
            dVar5 = Internal_DeltaArea((ON_2dPoint *)&p1.y,(ON_2dPoint *)local_98);
            register0x00001200 = dVar5 + stack0xfffffffffffffeb0;
          }
          else {
            if (((auStack_160[0] != CubicBezierPoint) ||
                (bVar1 = ON_OutlineFigurePoint::IsOffFigure((ON_OutlineFigurePoint *)auStack_160),
                !bVar1)) ||
               ((((uint)fVar2 <= (int)p.m_point.x + 2U ||
                 (((auStack_160[0] != pOVar3[(int)p.m_point.x + 1].m_point_type ||
                   (bVar1 = ON_OutlineFigurePoint::IsOffFigure(pOVar3 + ((int)p.m_point.x + 1)),
                   !bVar1)) || (auStack_160[0] != pOVar3[(int)p.m_point.x + 2].m_point_type)))) ||
                (bVar1 = ON_OutlineFigurePoint::IsOnFigure(pOVar3 + ((int)p.m_point.x + 2)), !bVar1)
                ))) break;
            for (t_1._4_4_ = 1; t_1._4_4_ < 4; t_1._4_4_ = t_1._4_4_ + 1) {
              _j_1 = (double)t_1._4_4_ * 0.25;
              for (local_1dc = 0; local_1dc < 4; local_1dc = local_1dc + 1) {
                dVar5 = ON_EvaluateBernsteinBasis(3,local_1dc,_j_1);
                cubic[(long)(t_1._4_4_ + -1) + -1][(long)local_1dc + 3] = dVar5;
              }
            }
            p0.y = p1.y;
            cv[0].x = p0.x;
            cv[0].y = (double)local_98;
            cv[1].x = p1.x;
            p.m_point.x = (float)((int)p.m_point.x + 1);
            ON_2dPoint::operator=((ON_2dPoint *)&cv[1].y,&pOVar3[(uint)p.m_point.x].m_point);
            p.m_point.x = (float)((int)p.m_point.x + 1);
            ON_2dPoint::operator=((ON_2dPoint *)&cv[2].y,&pOVar3[(uint)p.m_point.x].m_point);
            local_98 = (undefined1  [8])p1.y;
            p1.x = p0.x;
            for (local_1e0 = 0; local_1e0 < 3; local_1e0 = local_1e0 + 1) {
              p1.y = (double)local_98;
              p0.x = p1.x;
              local_220 = ::operator*(cubic[(long)local_1e0 + -1][3],(ON_2dPoint *)&p0.y);
              local_230 = ::operator*(cubic[local_1e0][0],(ON_2dPoint *)&cv[0].y);
              local_210 = ON_2dPoint::operator+(&local_220,&local_230);
              local_240 = ::operator*(cubic[local_1e0][1],(ON_2dPoint *)&cv[1].y);
              local_200 = ON_2dPoint::operator+(&local_210,&local_240);
              local_250 = ::operator*(cubic[local_1e0][2],(ON_2dPoint *)&cv[2].y);
              local_1f0 = ON_2dPoint::operator+(&local_200,&local_250);
              local_98 = (undefined1  [8])local_1f0.x;
              p1.x = local_1f0.y;
              dVar5 = Internal_DeltaArea((ON_2dPoint *)&p1.y,(ON_2dPoint *)local_98);
              register0x00001200 = dVar5 + stack0xfffffffffffffeb0;
            }
            p1.y = (double)local_98;
            p0.x = p1.x;
            local_98 = (undefined1  [8])cv[2].y;
            p1.x = cv[3].x;
            dVar5 = Internal_DeltaArea((ON_2dPoint *)&p1.y,(ON_2dPoint *)local_98);
            register0x00001200 = dVar5 + stack0xfffffffffffffeb0;
          }
        }
        if (p.m_point.x == fVar2) {
          p1.y = (double)local_98;
          p0.x = p1.x;
          ON_2dPoint::operator=((ON_2dPoint *)local_98,(ON_2fPoint *)&figure_end.m_point.y);
          dVar5 = Internal_DeltaArea((ON_2dPoint *)&p1.y,(ON_2dPoint *)local_98);
          this->m_area_estimate = (dVar5 + stack0xfffffffffffffeb0) * 0.5;
          this->m_area_status = '\x01';
        }
        else {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                     ,0x479,"","Area calculation failed.");
          if (((this->m_figure_type == Perimeter) || (this->m_figure_type == Unset)) ||
             (this->m_figure_type == Unknown)) {
            this->m_figure_type = NotPerimeter;
          }
        }
      }
    }
  }
  return this->m_area_estimate;
}

Assistant:

double ON_OutlineFigure::AreaEstimate() const
{
  while (0 == m_area_status)
  {
    m_area_estimate = ON_DBL_QNAN;
    m_area_status = 7;

    const ON__UINT32 figure_end_dex = Internal_FigureEndDex(false);
    if (0 == figure_end_dex)
      break;

    const ON_OutlineFigurePoint* a = m_points.Array();

    const ON_OutlineFigurePoint figure_start = a[0];
    const ON_OutlineFigurePoint figure_end = a[figure_end_dex];

    if (
      ON_OutlineFigurePoint::Type::BeginFigureOpen == figure_start.m_point_type
      || ON_OutlineFigurePoint::Type::EndFigureOpen == figure_end.m_point_type
      || figure_end_dex <= 2
      )
    {
      m_area_estimate = 0.0;
      m_area_status = 1;
      if (
        ON_OutlineFigure::Type::Perimeter == m_figure_type
        || ON_OutlineFigure::Type::Unset == m_figure_type
        || ON_OutlineFigure::Type::Unknown == m_figure_type
        )
      {
        m_figure_type = ON_OutlineFigure::Type::NotPerimeter;
      }
      break;
    }

    ON_2dPoint cv[4], p0, p1;

    double quad[3][3];
    double cubic[3][4];

    quad[0][0] = ON_UNSET_VALUE;
    cubic[0][0] = ON_UNSET_VALUE;
    double twice_area = 0.0;

    p1 = figure_start.m_point;
    ON__UINT32 i;
    for ( i = 1; i < figure_end_dex; i++)
    {
      const ON_OutlineFigurePoint p = a[i];
      p0 = p1;
      p1 = p.m_point;

      if (ON_OutlineFigurePoint::Type::LineTo == p.m_point_type)
      {
        twice_area += Internal_DeltaArea(p0, p1);
        continue;
      }

      if (ON_OutlineFigurePoint::Type::QuadraticBezierPoint == p.m_point_type)
      {
        if (
          p.IsOffFigure()
          && i + 1 < figure_end_dex
          && p.m_point_type == a[i + 1].m_point_type
          &&  a[i + 1].IsOnFigure()
          )
        {
          // approximate quadratic with 4 line segments
          if (ON_UNSET_VALUE == quad[0][0])
          {
            for (int tdex = 1; tdex <= 3; tdex++)
            {
              const double t = 0.25 * tdex;
              //const double s = 1.0 - t;
              for (int cvdex = 0; cvdex < 3; cvdex++)
              {
                quad[tdex - 1][cvdex] = ON_EvaluateBernsteinBasis(2, cvdex, t);
              }
            }
          }
          cv[0] = p0;
          cv[1] = p1;
          cv[2] = a[++i].m_point;
          p1 = p0;
          for (int j = 0; j < 3; j++)
          {
            p0 = p1;
            p1 = quad[j][0] * cv[0] + quad[j][1] * cv[1] + quad[j][2] * cv[2];
            twice_area += Internal_DeltaArea(p0, p1);
          }
          p0 = p1;
          p1 = cv[2];
          twice_area += Internal_DeltaArea(p0, p1);
          continue;
        }
        // error
        break;
      }

      if (ON_OutlineFigurePoint::Type::CubicBezierPoint == p.m_point_type)
      {
        if (
          // approximate cubic with 4 line segments
          p.IsOffFigure()
          && i + 2 < figure_end_dex
          && p.m_point_type == a[i + 1].m_point_type
          && a[i + 1].IsOffFigure()
          && p.m_point_type == a[i + 2].m_point_type
          && a[i + 2].IsOnFigure()
          )
        {
          if (ON_UNSET_VALUE == cubic[0][0])
          {
            for (int tdex = 1; tdex <= 3; tdex++)
            {
              const double t = 0.25 * tdex;
              //const double s = 1.0 - t;
              for (int cvdex = 0; cvdex < 4; cvdex++)
              {
                cubic[tdex - 1][cvdex] = ON_EvaluateBernsteinBasis(3, cvdex, t);
              }
            }
          }
          cv[0] = p0;
          cv[1] = p1;
          cv[2] = a[++i].m_point;
          cv[3] = a[++i].m_point;
          p1 = p0;
          for (int j = 0; j < 3; j++)
          {
            p0 = p1;
            p1 = cubic[j][0] * cv[0] + cubic[j][1] * cv[1] + cubic[j][2] * cv[2] + cubic[j][3] * cv[3];
            twice_area += Internal_DeltaArea(p0, p1);
          }
          p0 = p1;
          p1 = cv[3];
          twice_area += Internal_DeltaArea(p0, p1);
          continue;
        }
        // error
        break;
      }

      break;
    }

    if (i != figure_end_dex)
    {
      ON_ERROR("Area calculation failed.");
      if (
        ON_OutlineFigure::Type::Perimeter == m_figure_type
        || ON_OutlineFigure::Type::Unset == m_figure_type
        || ON_OutlineFigure::Type::Unknown == m_figure_type
        )
      {
        m_figure_type = ON_OutlineFigure::Type::NotPerimeter;
      }
      break; // error
    }

    p0 = p1;
    p1 = figure_start.m_point;
    twice_area += Internal_DeltaArea(p0, p1);

    m_area_estimate = 0.5*twice_area;
    m_area_status = 1;
    break;
  }

  return m_area_estimate;
}